

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

char * ures_getVersionNumberInternal_63(UResourceBundle *resourceBundle)

{
  UChar *us;
  char *pcVar1;
  uint uVar2;
  int32_t minor_len;
  UErrorCode status;
  uint local_28 [2];
  
  if (resourceBundle == (UResourceBundle *)0x0) {
    return (char *)0x0;
  }
  if (resourceBundle->fVersion == (char *)0x0) {
    local_28[0] = 0;
    local_28[1] = 0;
    us = ures_getStringByKey_63
                   (resourceBundle,"Version",(int32_t *)local_28,(UErrorCode *)(local_28 + 1));
    uVar2 = 1;
    if (1 < (int)local_28[0]) {
      uVar2 = local_28[0];
    }
    pcVar1 = (char *)uprv_malloc_63((ulong)(uVar2 + 1));
    resourceBundle->fVersion = pcVar1;
    if (pcVar1 != (char *)0x0) {
      if ((int)local_28[0] < 1) {
        pcVar1[0] = '0';
        pcVar1[1] = '\0';
      }
      else {
        u_UCharsToChars_63(us,pcVar1,local_28[0]);
        resourceBundle->fVersion[uVar2] = '\0';
      }
      if (pcVar1 != (char *)0x0) goto LAB_002d0d29;
    }
    pcVar1 = (char *)0x0;
  }
  else {
LAB_002d0d29:
    pcVar1 = resourceBundle->fVersion;
  }
  return pcVar1;
}

Assistant:

U_INTERNAL const char* U_EXPORT2 
ures_getVersionNumberInternal(const UResourceBundle *resourceBundle)
{
    if (!resourceBundle) return NULL;

    if(resourceBundle->fVersion == NULL) {

        /* If the version ID has not been built yet, then do so.  Retrieve */
        /* the minor version from the file. */
        UErrorCode status = U_ZERO_ERROR;
        int32_t minor_len = 0;
        int32_t len;

        const UChar* minor_version = ures_getStringByKey(resourceBundle, kVersionTag, &minor_len, &status);
        
        /* Determine the length of of the final version string.  This is */
        /* the length of the major part + the length of the separator */
        /* (==1) + the length of the minor part (+ 1 for the zero byte at */
        /* the end). */

        len = (minor_len > 0) ? minor_len : 1;
    
        /* Allocate the string, and build it up. */
        /* + 1 for zero byte */


        ((UResourceBundle *)resourceBundle)->fVersion = (char *)uprv_malloc(1 + len); 
        /* Check for null pointer. */
        if (((UResourceBundle *)resourceBundle)->fVersion == NULL) {
            return NULL;
        }
       
        if(minor_len > 0) {
            u_UCharsToChars(minor_version, resourceBundle->fVersion , minor_len);
            resourceBundle->fVersion[len] =  '\0';
        }
        else {
            uprv_strcpy(resourceBundle->fVersion, kDefaultMinorVersion);
        }
    }

    return resourceBundle->fVersion;
}